

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gears.c
# Opt level: O3

void gear(GLfloat inner_radius,GLfloat outer_radius,GLfloat width,GLint teeth,GLfloat tooth_depth)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  PFNGLVERTEX3FPROC p_Var7;
  PFNGLNORMAL3FPROC p_Var8;
  int iVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  fVar10 = outer_radius + -0.35;
  fVar14 = (float)teeth;
  fVar11 = (6.2831855 / fVar14) * 0.25;
  (*glad_glShadeModel)(0x1d00);
  (*glad_glNormal3f)(0.0,0.0,1.0);
  (*glad_glBegin)(8);
  if (-1 < teeth) {
    fVar15 = width * 0.5;
    iVar9 = 0;
    do {
      p_Var7 = glad_glVertex3f;
      fVar16 = (((float)iVar9 + (float)iVar9) * 3.1415927) / fVar14;
      dVar1 = (double)fVar16;
      dVar2 = cos(dVar1);
      dVar3 = sin(dVar1);
      (*p_Var7)((float)dVar2 * inner_radius,(float)dVar3 * inner_radius,fVar15);
      p_Var7 = glad_glVertex3f;
      dVar2 = cos(dVar1);
      dVar3 = sin(dVar1);
      (*p_Var7)((float)dVar2 * fVar10,(float)dVar3 * fVar10,fVar15);
      p_Var7 = glad_glVertex3f;
      if (iVar9 < teeth) {
        dVar2 = cos(dVar1);
        dVar1 = sin(dVar1);
        (*p_Var7)((float)dVar2 * inner_radius,(float)dVar1 * inner_radius,fVar15);
        p_Var7 = glad_glVertex3f;
        dVar1 = (double)(fVar16 + fVar11 * 3.0);
        dVar2 = cos(dVar1);
        dVar1 = sin(dVar1);
        (*p_Var7)((float)dVar2 * fVar10,(float)dVar1 * fVar10,fVar15);
      }
      iVar9 = iVar9 + 1;
    } while (teeth + 1 != iVar9);
  }
  fVar15 = outer_radius + 0.35;
  iVar9 = 0;
  (*glad_glEnd)();
  (*glad_glBegin)(7);
  if (0 < teeth) {
    fVar16 = width * 0.5;
    do {
      p_Var7 = glad_glVertex3f;
      fVar12 = (((float)iVar9 + (float)iVar9) * 3.1415927) / fVar14;
      dVar1 = cos((double)fVar12);
      dVar2 = sin((double)fVar12);
      (*p_Var7)((float)dVar1 * fVar10,(float)dVar2 * fVar10,fVar16);
      p_Var7 = glad_glVertex3f;
      dVar1 = cos((double)(fVar11 + fVar12));
      dVar2 = sin((double)(fVar11 + fVar12));
      (*p_Var7)((float)dVar1 * fVar15,(float)dVar2 * fVar15,fVar16);
      p_Var7 = glad_glVertex3f;
      dVar1 = (double)(fVar11 + fVar11 + fVar12);
      dVar2 = cos(dVar1);
      dVar1 = sin(dVar1);
      (*p_Var7)((float)dVar2 * fVar15,(float)dVar1 * fVar15,fVar16);
      p_Var7 = glad_glVertex3f;
      dVar1 = (double)(fVar12 + fVar11 * 3.0);
      dVar2 = cos(dVar1);
      dVar1 = sin(dVar1);
      (*p_Var7)((float)dVar2 * fVar10,(float)dVar1 * fVar10,fVar16);
      iVar9 = iVar9 + 1;
    } while (teeth != iVar9);
  }
  iVar9 = 0;
  (*glad_glEnd)();
  (*glad_glNormal3f)(0.0,0.0,-1.0);
  (*glad_glBegin)(8);
  if (-1 < teeth) {
    fVar16 = width * -0.5;
    do {
      p_Var7 = glad_glVertex3f;
      fVar12 = (((float)iVar9 + (float)iVar9) * 3.1415927) / fVar14;
      dVar1 = (double)fVar12;
      dVar2 = cos(dVar1);
      dVar3 = sin(dVar1);
      (*p_Var7)((float)dVar2 * fVar10,(float)dVar3 * fVar10,fVar16);
      p_Var7 = glad_glVertex3f;
      dVar2 = cos(dVar1);
      dVar3 = sin(dVar1);
      (*p_Var7)((float)dVar2 * inner_radius,(float)dVar3 * inner_radius,fVar16);
      p_Var7 = glad_glVertex3f;
      if (iVar9 < teeth) {
        dVar2 = (double)(fVar12 + fVar11 * 3.0);
        dVar3 = cos(dVar2);
        dVar2 = sin(dVar2);
        (*p_Var7)((float)dVar3 * fVar10,(float)dVar2 * fVar10,fVar16);
        p_Var7 = glad_glVertex3f;
        dVar2 = cos(dVar1);
        dVar1 = sin(dVar1);
        (*p_Var7)((float)dVar2 * inner_radius,(float)dVar1 * inner_radius,fVar16);
      }
      iVar9 = iVar9 + 1;
    } while (teeth + 1 != iVar9);
  }
  iVar9 = 0;
  (*glad_glEnd)();
  (*glad_glBegin)(7);
  if (0 < teeth) {
    fVar16 = width * -0.5;
    do {
      p_Var7 = glad_glVertex3f;
      fVar12 = (((float)iVar9 + (float)iVar9) * 3.1415927) / fVar14;
      dVar1 = (double)(fVar11 * 3.0 + fVar12);
      dVar2 = cos(dVar1);
      dVar1 = sin(dVar1);
      (*p_Var7)((float)dVar2 * fVar10,(float)dVar1 * fVar10,fVar16);
      p_Var7 = glad_glVertex3f;
      dVar1 = (double)(fVar11 + fVar11 + fVar12);
      dVar2 = cos(dVar1);
      dVar1 = sin(dVar1);
      (*p_Var7)((float)dVar2 * fVar15,(float)dVar1 * fVar15,fVar16);
      p_Var7 = glad_glVertex3f;
      dVar1 = cos((double)(fVar11 + fVar12));
      dVar2 = sin((double)(fVar11 + fVar12));
      (*p_Var7)((float)dVar1 * fVar15,(float)dVar2 * fVar15,fVar16);
      p_Var7 = glad_glVertex3f;
      dVar1 = cos((double)fVar12);
      dVar2 = sin((double)fVar12);
      (*p_Var7)((float)dVar1 * fVar10,(float)dVar2 * fVar10,fVar16);
      iVar9 = iVar9 + 1;
    } while (teeth != iVar9);
  }
  iVar9 = 0;
  (*glad_glEnd)();
  (*glad_glBegin)(8);
  fVar16 = width * 0.5;
  fVar12 = width * -0.5;
  if (0 < teeth) {
    do {
      p_Var7 = glad_glVertex3f;
      fVar13 = (((float)iVar9 + (float)iVar9) * 3.1415927) / fVar14;
      dVar1 = (double)fVar13;
      dVar2 = cos(dVar1);
      dVar3 = sin(dVar1);
      (*p_Var7)((float)dVar2 * fVar10,(float)dVar3 * fVar10,fVar16);
      p_Var7 = glad_glVertex3f;
      dVar2 = cos(dVar1);
      dVar3 = sin(dVar1);
      (*p_Var7)((float)dVar2 * fVar10,(float)dVar3 * fVar10,fVar12);
      dVar2 = (double)(fVar11 + fVar13);
      dVar3 = cos(dVar2);
      dVar4 = cos(dVar1);
      fVar17 = (float)dVar3 * fVar15 + (float)dVar4 * -fVar10;
      dVar3 = sin(dVar2);
      dVar4 = sin(dVar1);
      fVar18 = (float)dVar3 * fVar15 + (float)dVar4 * -fVar10;
      fVar19 = SQRT(fVar17 * fVar17 + fVar18 * fVar18);
      (*glad_glNormal3f)(fVar18 / fVar19,-fVar17 / fVar19,0.0);
      p_Var7 = glad_glVertex3f;
      dVar3 = cos(dVar2);
      dVar4 = sin(dVar2);
      (*p_Var7)((float)dVar3 * fVar15,(float)dVar4 * fVar15,fVar16);
      p_Var7 = glad_glVertex3f;
      dVar3 = cos(dVar2);
      dVar2 = sin(dVar2);
      (*p_Var7)((float)dVar3 * fVar15,(float)dVar2 * fVar15,fVar12);
      p_Var8 = glad_glNormal3f;
      dVar2 = cos(dVar1);
      dVar3 = sin(dVar1);
      (*p_Var8)((float)dVar2,(float)dVar3,0.0);
      p_Var7 = glad_glVertex3f;
      dVar2 = (double)(fVar11 + fVar11 + fVar13);
      dVar3 = cos(dVar2);
      dVar4 = sin(dVar2);
      (*p_Var7)((float)dVar3 * fVar15,(float)dVar4 * fVar15,fVar16);
      p_Var7 = glad_glVertex3f;
      dVar3 = cos(dVar2);
      dVar4 = sin(dVar2);
      (*p_Var7)((float)dVar3 * fVar15,(float)dVar4 * fVar15,fVar12);
      dVar3 = (double)(fVar13 + fVar11 * 3.0);
      dVar4 = cos(dVar3);
      dVar5 = cos(dVar2);
      dVar6 = sin(dVar3);
      dVar2 = sin(dVar2);
      (*glad_glNormal3f)((float)dVar6 * fVar10 + (float)dVar2 * -fVar15,
                         -((float)dVar4 * fVar10 + (float)dVar5 * -fVar15),0.0);
      p_Var7 = glad_glVertex3f;
      dVar2 = cos(dVar3);
      dVar4 = sin(dVar3);
      (*p_Var7)((float)dVar2 * fVar10,(float)dVar4 * fVar10,fVar16);
      p_Var7 = glad_glVertex3f;
      dVar2 = cos(dVar3);
      dVar3 = sin(dVar3);
      (*p_Var7)((float)dVar2 * fVar10,(float)dVar3 * fVar10,fVar12);
      p_Var8 = glad_glNormal3f;
      dVar2 = cos(dVar1);
      dVar1 = sin(dVar1);
      (*p_Var8)((float)dVar2,(float)dVar1,0.0);
      iVar9 = iVar9 + 1;
    } while (teeth != iVar9);
  }
  (*glad_glVertex3f)(fVar10,fVar10 * 0.0,fVar16);
  (*glad_glVertex3f)(fVar10,fVar10 * 0.0,fVar12);
  iVar9 = 0;
  (*glad_glEnd)();
  (*glad_glShadeModel)(0x1d01);
  (*glad_glBegin)(8);
  if (-1 < teeth) {
    do {
      p_Var8 = glad_glNormal3f;
      dVar1 = (double)((((float)iVar9 + (float)iVar9) * 3.1415927) / fVar14);
      dVar2 = cos(dVar1);
      dVar3 = sin(dVar1);
      (*p_Var8)(-(float)dVar2,-(float)dVar3,0.0);
      p_Var7 = glad_glVertex3f;
      dVar2 = cos(dVar1);
      dVar3 = sin(dVar1);
      (*p_Var7)((float)dVar2 * inner_radius,(float)dVar3 * inner_radius,fVar12);
      p_Var7 = glad_glVertex3f;
      dVar2 = cos(dVar1);
      dVar1 = sin(dVar1);
      (*p_Var7)((float)dVar2 * inner_radius,(float)dVar1 * inner_radius,fVar16);
      iVar9 = iVar9 + 1;
    } while (teeth + 1 != iVar9);
  }
  (*glad_glEnd)();
  return;
}

Assistant:

static void
gear(GLfloat inner_radius, GLfloat outer_radius, GLfloat width,
  GLint teeth, GLfloat tooth_depth)
{
  GLint i;
  GLfloat r0, r1, r2;
  GLfloat angle, da;
  GLfloat u, v, len;

  r0 = inner_radius;
  r1 = outer_radius - tooth_depth / 2.f;
  r2 = outer_radius + tooth_depth / 2.f;

  da = 2.f * (float) M_PI / teeth / 4.f;

  glShadeModel(GL_FLAT);

  glNormal3f(0.f, 0.f, 1.f);

  /* draw front face */
  glBegin(GL_QUAD_STRIP);
  for (i = 0; i <= teeth; i++) {
    angle = i * 2.f * (float) M_PI / teeth;
    glVertex3f(r0 * (float) cos(angle), r0 * (float) sin(angle), width * 0.5f);
    glVertex3f(r1 * (float) cos(angle), r1 * (float) sin(angle), width * 0.5f);
    if (i < teeth) {
      glVertex3f(r0 * (float) cos(angle), r0 * (float) sin(angle), width * 0.5f);
      glVertex3f(r1 * (float) cos(angle + 3 * da), r1 * (float) sin(angle + 3 * da), width * 0.5f);
    }
  }
  glEnd();

  /* draw front sides of teeth */
  glBegin(GL_QUADS);
  da = 2.f * (float) M_PI / teeth / 4.f;
  for (i = 0; i < teeth; i++) {
    angle = i * 2.f * (float) M_PI / teeth;

    glVertex3f(r1 * (float) cos(angle), r1 * (float) sin(angle), width * 0.5f);
    glVertex3f(r2 * (float) cos(angle + da), r2 * (float) sin(angle + da), width * 0.5f);
    glVertex3f(r2 * (float) cos(angle + 2 * da), r2 * (float) sin(angle + 2 * da), width * 0.5f);
    glVertex3f(r1 * (float) cos(angle + 3 * da), r1 * (float) sin(angle + 3 * da), width * 0.5f);
  }
  glEnd();

  glNormal3f(0.0, 0.0, -1.0);

  /* draw back face */
  glBegin(GL_QUAD_STRIP);
  for (i = 0; i <= teeth; i++) {
    angle = i * 2.f * (float) M_PI / teeth;
    glVertex3f(r1 * (float) cos(angle), r1 * (float) sin(angle), -width * 0.5f);
    glVertex3f(r0 * (float) cos(angle), r0 * (float) sin(angle), -width * 0.5f);
    if (i < teeth) {
      glVertex3f(r1 * (float) cos(angle + 3 * da), r1 * (float) sin(angle + 3 * da), -width * 0.5f);
      glVertex3f(r0 * (float) cos(angle), r0 * (float) sin(angle), -width * 0.5f);
    }
  }
  glEnd();

  /* draw back sides of teeth */
  glBegin(GL_QUADS);
  da = 2.f * (float) M_PI / teeth / 4.f;
  for (i = 0; i < teeth; i++) {
    angle = i * 2.f * (float) M_PI / teeth;

    glVertex3f(r1 * (float) cos(angle + 3 * da), r1 * (float) sin(angle + 3 * da), -width * 0.5f);
    glVertex3f(r2 * (float) cos(angle + 2 * da), r2 * (float) sin(angle + 2 * da), -width * 0.5f);
    glVertex3f(r2 * (float) cos(angle + da), r2 * (float) sin(angle + da), -width * 0.5f);
    glVertex3f(r1 * (float) cos(angle), r1 * (float) sin(angle), -width * 0.5f);
  }
  glEnd();

  /* draw outward faces of teeth */
  glBegin(GL_QUAD_STRIP);
  for (i = 0; i < teeth; i++) {
    angle = i * 2.f * (float) M_PI / teeth;

    glVertex3f(r1 * (float) cos(angle), r1 * (float) sin(angle), width * 0.5f);
    glVertex3f(r1 * (float) cos(angle), r1 * (float) sin(angle), -width * 0.5f);
    u = r2 * (float) cos(angle + da) - r1 * (float) cos(angle);
    v = r2 * (float) sin(angle + da) - r1 * (float) sin(angle);
    len = (float) sqrt(u * u + v * v);
    u /= len;
    v /= len;
    glNormal3f(v, -u, 0.0);
    glVertex3f(r2 * (float) cos(angle + da), r2 * (float) sin(angle + da), width * 0.5f);
    glVertex3f(r2 * (float) cos(angle + da), r2 * (float) sin(angle + da), -width * 0.5f);
    glNormal3f((float) cos(angle), (float) sin(angle), 0.f);
    glVertex3f(r2 * (float) cos(angle + 2 * da), r2 * (float) sin(angle + 2 * da), width * 0.5f);
    glVertex3f(r2 * (float) cos(angle + 2 * da), r2 * (float) sin(angle + 2 * da), -width * 0.5f);
    u = r1 * (float) cos(angle + 3 * da) - r2 * (float) cos(angle + 2 * da);
    v = r1 * (float) sin(angle + 3 * da) - r2 * (float) sin(angle + 2 * da);
    glNormal3f(v, -u, 0.f);
    glVertex3f(r1 * (float) cos(angle + 3 * da), r1 * (float) sin(angle + 3 * da), width * 0.5f);
    glVertex3f(r1 * (float) cos(angle + 3 * da), r1 * (float) sin(angle + 3 * da), -width * 0.5f);
    glNormal3f((float) cos(angle), (float) sin(angle), 0.f);
  }

  glVertex3f(r1 * (float) cos(0), r1 * (float) sin(0), width * 0.5f);
  glVertex3f(r1 * (float) cos(0), r1 * (float) sin(0), -width * 0.5f);

  glEnd();

  glShadeModel(GL_SMOOTH);

  /* draw inside radius cylinder */
  glBegin(GL_QUAD_STRIP);
  for (i = 0; i <= teeth; i++) {
    angle = i * 2.f * (float) M_PI / teeth;
    glNormal3f(-(float) cos(angle), -(float) sin(angle), 0.f);
    glVertex3f(r0 * (float) cos(angle), r0 * (float) sin(angle), -width * 0.5f);
    glVertex3f(r0 * (float) cos(angle), r0 * (float) sin(angle), width * 0.5f);
  }
  glEnd();

}